

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.cpp
# Opt level: O0

void __thiscall
siamese::GrowingAlignedByteMatrix::Free(GrowingAlignedByteMatrix *this,Allocator *allocator)

{
  long *in_RDI;
  uint8_t *in_stack_00000020;
  Allocator *in_stack_00000028;
  
  if (*in_RDI != 0) {
    pktalloc::Allocator::Free(in_stack_00000028,in_stack_00000020);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 2) = 0;
    *(undefined4 *)((long)in_RDI + 0x14) = 0;
  }
  return;
}

Assistant:

void GrowingAlignedByteMatrix::Free(pktalloc::Allocator* allocator)
{
    SIAMESE_DEBUG_ASSERT(allocator);
    if (Data)
    {
        allocator->Free(Data);
        Data             = nullptr;
        AllocatedRows    = 0;
        AllocatedColumns = 0;
    }
}